

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O2

void insertion_sort_suite::sort_4321(void)

{
  array<int,_4UL> expect;
  array<int,_4UL> storage;
  int local_18 [2];
  
  storage._M_elems[0] = 0x2c;
  storage._M_elems[1] = 0x21;
  storage._M_elems[2] = 0x16;
  storage._M_elems[3] = 0xb;
  vista::insertion_sort<false,int*,std::less<int&>>(&storage,local_18);
  expect._M_elems[0] = 0xb;
  expect._M_elems[1] = 0x16;
  expect._M_elems[2] = 0x21;
  expect._M_elems[3] = 0x2c;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x5ac,"void insertion_sort_suite::sort_4321()",storage._M_elems,local_18,
             expect._M_elems,storage._M_elems);
  return;
}

Assistant:

void sort_4321()
{
    std::array<int, 4> storage = { 44, 33, 22, 11 };
    insertion_sort(storage.begin(), storage.end());
    {
        std::array<int, 4> expect = { 11, 22, 33, 44 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
}